

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O1

void __thiscall QFontDialogPrivate::updateStyles(QFontDialogPrivate *this)

{
  QWidget *this_00;
  QAbstractItemView *pQVar1;
  QLineEdit *this_01;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QAbstractItemModel *pQVar6;
  QStyle *pQVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  char *pcVar11;
  CaseSensitivity CVar12;
  long lVar13;
  long in_FS_OFFSET;
  QStringView QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QStringView QVar20;
  QLatin1String QVar21;
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  qsizetype local_c8;
  QArrayDataPointer<QString> local_b8;
  QArrayDataPointer<QString> local_a0;
  QArrayDataPointer<QString> local_88;
  QArrayDataPointer<QString> local_70;
  QArrayData *local_58;
  QString *pQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,pQVar1);
  iVar4 = (int)local_58;
  lVar13 = (long)(int)local_58;
  if (lVar13 < 0) {
    local_58 = (QArrayData *)0x0;
    pQStack_50 = (QString *)0x0;
    tStack_48.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    local_58 = &(local_a0.ptr[lVar13].d.d)->super_QArrayData;
    pQStack_50 = (QString *)local_a0.ptr[lVar13].d.ptr;
    tStack_48.ptr = (QAbstractItemModel *)local_a0.ptr[lVar13].d.size;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (-1 < iVar4) {
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a0);
  }
  QFontDatabase::styles((QString *)&local_b8);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  pQVar6 = QAbstractItemView::model((QAbstractItemView *)this->styleList);
  QStringListModel::setStringList((QList_conflict *)pQVar6);
  if ((undefined1 *)local_b8.size == (undefined1 *)0x0) {
    QLineEdit::clear(this->styleEdit);
    this->smoothScalable = false;
    goto LAB_00505717;
  }
  pQVar6 = (QAbstractItemModel *)(this->style).d.size;
  if (pQVar6 != (QAbstractItemModel *)0x0) {
    local_88.d = (Data *)(this->style).d.d;
    local_88.ptr = (QString *)(this->style).d.ptr;
    if ((QArrayData *)local_88.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_88.d)->ref_)->ref_)._q_value.super___atomic_base<int>.
      _M_i = (((QArrayData *)&((QArrayData *)local_88.d)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar10 = false;
    bVar3 = false;
    local_88.size = (qsizetype)pQVar6;
    do {
      pQVar6 = QAbstractItemView::model((QAbstractItemView *)this->styleList);
      local_58 = (QArrayData *)0xffffffffffffffff;
      pQStack_50 = (QString *)0x0;
      tStack_48.ptr = (QAbstractItemModel *)0x0;
      iVar4 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,(QModelIndex *)&local_58);
      if (0 < iVar4) {
        iVar4 = 0;
        do {
          QFontListView::text((QString *)&local_58,this->styleList,iVar4);
          if ((QAbstractItemModel *)local_88.size == tStack_48.ptr) {
            QVar14.m_data = (storage_type_conflict *)local_88.ptr;
            QVar14.m_size = local_88.size;
            QVar20.m_data = (storage_type_conflict *)pQStack_50;
            QVar20.m_size = (qsizetype)tStack_48.ptr;
            cVar2 = QtPrivate::equalStrings(QVar14,QVar20);
          }
          else {
            cVar2 = '\0';
          }
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,0x10);
            }
          }
          if (cVar2 != '\0') {
            pQVar1 = (QAbstractItemView *)this->styleList;
            pQVar6 = QAbstractItemView::model(pQVar1);
            local_70.d = (Data *)0xffffffffffffffff;
            local_70.ptr = (QString *)0x0;
            local_70.size = 0;
            (**(code **)(*(long *)pQVar6 + 0x60))((QModelIndex *)&local_58,pQVar6,iVar4,0,&local_70)
            ;
            QAbstractItemView::setCurrentIndex(pQVar1,(QModelIndex *)&local_58);
            bVar3 = true;
            break;
          }
          iVar4 = iVar4 + 1;
          pQVar6 = QAbstractItemView::model((QAbstractItemView *)this->styleList);
          local_58 = (QArrayData *)0xffffffffffffffff;
          pQStack_50 = (QString *)0x0;
          tStack_48.ptr = (QAbstractItemModel *)0x0;
          iVar5 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,(QModelIndex *)&local_58);
        } while (iVar4 < iVar5);
      }
      if (bVar10 || bVar3) goto LAB_00505398;
      QVar15.m_data = (char *)0x6;
      QVar15.m_size = (qsizetype)&local_88;
      lVar13 = QString::indexOf(QVar15,0x6f575a,CaseInsensitive);
      if (lVar13 == -1) {
        QVar16.m_data = (char *)0x7;
        QVar16.m_size = (qsizetype)&local_88;
        lVar13 = QString::indexOf(QVar16,0x6f5761,CaseInsensitive);
        pcVar11 = (char *)0x7;
        if (lVar13 == -1) {
          QVar17.m_data = (char *)0x7;
          QVar17.m_size = (qsizetype)&local_88;
          lVar13 = QString::indexOf(QVar17,0x6f5769,CaseInsensitive);
          if (lVar13 == -1) {
            QVar18.m_data = (char *)0x6;
            QVar18.m_size = (qsizetype)&local_88;
            lVar13 = QString::indexOf(QVar18,0x6f5771,CaseInsensitive);
            if (lVar13 == -1) goto LAB_00505398;
            pcVar11 = (char *)0x6;
            pcVar8 = (char *)0x7;
            pcVar9 = "Normal";
            CVar12 = 0x6f5769;
          }
          else {
            pcVar11 = (char *)0x7;
            pcVar8 = (char *)0x6;
            pcVar9 = "Regular";
            CVar12 = 0x6f5771;
          }
        }
        else {
          pcVar8 = (char *)0x6;
          pcVar9 = "Oblique";
          CVar12 = 0x6f575a;
        }
      }
      else {
        pcVar11 = (char *)0x6;
        pcVar8 = (char *)0x7;
        pcVar9 = "Italic";
        CVar12 = 0x6f5761;
      }
      QVar19.m_data = pcVar11;
      QVar19.m_size = (qsizetype)&local_88;
      QVar21.m_data = pcVar8;
      QVar21.m_size = (qsizetype)pcVar9;
      QString::replace(QVar19,QVar21,CVar12);
      bVar10 = true;
    } while( true );
  }
  pQVar1 = (QAbstractItemView *)this->styleList;
  pQVar6 = QAbstractItemView::model(pQVar1);
  local_70.d = (Data *)0xffffffffffffffff;
  local_70.ptr = (QString *)0x0;
  local_70.size = 0;
  (**(code **)(*(long *)pQVar6 + 0x60))((QModelIndex *)&local_58,pQVar6,0,0);
  QAbstractItemView::setCurrentIndex(pQVar1,(QModelIndex *)&local_58);
LAB_0050547e:
  this_01 = this->styleEdit;
  pQVar1 = (QAbstractItemView *)this->styleList;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,pQVar1);
  iVar4 = (int)local_58;
  lVar13 = (long)(int)local_58;
  if (lVar13 < 0) {
    local_58 = (QArrayData *)0x0;
    pQStack_50 = (QString *)0x0;
    tStack_48.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    local_58 = &(local_88.ptr[lVar13].d.d)->super_QArrayData;
    pQStack_50 = (QString *)local_88.ptr[lVar13].d.ptr;
    tStack_48.ptr = (QAbstractItemModel *)local_88.ptr[lVar13].d.size;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (-1 < iVar4) {
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  }
  QLineEdit::setText(this_01,(QString *)&local_58);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  pQVar7 = QWidget::style(this_00);
  iVar4 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0xd,0,this_00,0);
  if ((iVar4 != 0) && (bVar3 = QWidget::hasFocus((QWidget *)this->styleList), bVar3)) {
    QLineEdit::selectAll(this->styleEdit);
  }
  pQVar1 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,pQVar1);
  iVar4 = (int)local_58;
  lVar13 = (long)(int)local_58;
  if (lVar13 < 0) {
    local_d8 = (QArrayData *)0x0;
    pcStack_d0 = (char16_t *)0x0;
    local_c8 = 0;
  }
  else {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    local_d8 = &(local_70.ptr[lVar13].d.d)->super_QArrayData;
    pcStack_d0 = local_70.ptr[lVar13].d.ptr;
    local_c8 = local_70.ptr[lVar13].d.size;
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (-1 < iVar4) {
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  }
  pQVar1 = (QAbstractItemView *)this->styleList;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,pQVar1);
  iVar4 = (int)local_58;
  lVar13 = (long)(int)local_58;
  if (lVar13 < 0) {
    local_f8 = (QArrayData *)0x0;
    pcStack_f0 = (char16_t *)0x0;
    local_e8 = 0;
  }
  else {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    local_f8 = &(pQStack_50[lVar13].d.d)->super_QArrayData;
    pcStack_f0 = pQStack_50[lVar13].d.ptr;
    local_e8 = pQStack_50[lVar13].d.size;
    if (local_f8 != (QArrayData *)0x0) {
      LOCK();
      (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (-1 < iVar4) {
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
  }
  bVar3 = (bool)QFontDatabase::isSmoothlyScalable((QString *)&local_d8,(QString *)&local_f8);
  this->smoothScalable = bVar3;
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,2,0x10);
    }
  }
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,0x10);
    }
  }
LAB_00505717:
  updateSizes(this);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00505398:
  if (!bVar3) {
    pQVar1 = (QAbstractItemView *)this->styleList;
    pQVar6 = QAbstractItemView::model(pQVar1);
    local_70.d = (Data *)0xffffffffffffffff;
    local_70.ptr = (QString *)0x0;
    local_70.size = 0;
    (**(code **)(*(long *)pQVar6 + 0x60))((QModelIndex *)&local_58,pQVar6,0,0);
    QAbstractItemView::setCurrentIndex(pQVar1,(QModelIndex *)&local_58);
  }
  if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
    }
  }
  goto LAB_0050547e;
}

Assistant:

void QFontDialogPrivate::updateStyles()
{
    Q_Q(QFontDialog);
    QStringList styles = QFontDatabase::styles(familyList->currentText());
    styleList->model()->setStringList(styles);

    if (styles.isEmpty()) {
        styleEdit->clear();
        smoothScalable = false;
    } else {
        if (!style.isEmpty()) {
            bool found = false;
            bool first = true;
            QString cstyle = style;

        redo:
            for (int i = 0; i < static_cast<int>(styleList->count()); i++) {
                if (cstyle == styleList->text(i)) {
                     styleList->setCurrentItem(i);
                     found = true;
                     break;
                 }
            }
            if (!found && first) {
                if (cstyle.contains("Italic"_L1)) {
                    cstyle.replace("Italic"_L1, "Oblique"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Oblique"_L1)) {
                    cstyle.replace("Oblique"_L1, "Italic"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Regular"_L1)) {
                    cstyle.replace("Regular"_L1, "Normal"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Normal"_L1)) {
                    cstyle.replace("Normal"_L1, "Regular"_L1);
                    first = false;
                    goto redo;
                }
            }
            if (!found)
                styleList->setCurrentItem(0);
        } else {
            styleList->setCurrentItem(0);
        }

        styleEdit->setText(styleList->currentText());
        if (q->style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, q)
                && styleList->hasFocus())
            styleEdit->selectAll();

        smoothScalable = QFontDatabase::isSmoothlyScalable(familyList->currentText(), styleList->currentText());
    }

    updateSizes();
}